

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest17::initTest(FunctionalTest17 *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_00;
  float *pfVar5;
  uint local_cc;
  undefined1 local_c8 [8];
  string vs_body;
  string te_body;
  string tc_body;
  undefined1 local_58 [8];
  string gs_body;
  string fs_body;
  Functions *gl;
  FunctionalTest17 *this_local;
  Functions *gl_00;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  (*gl_00->patchParameteri)(0x8e72,1);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glPatchParameteri() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2413);
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2417);
  (*gl_00->bindVertexArray)(this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x241a);
  getFragmentShaderBody_abi_cxx11_((string *)((long)&gs_body.field_2 + 8),this);
  getGeometryShaderBody_abi_cxx11_((string *)local_58,this);
  getTessellationControlShaderBody_abi_cxx11_((string *)((long)&te_body.field_2 + 8),this);
  getTessellationEvaluationShaderBody_abi_cxx11_((string *)((long)&vs_body.field_2 + 8),this);
  getVertexShaderBody_abi_cxx11_((string *)local_c8,this);
  local_cc = 0;
  bVar1 = Utils::buildProgram(gl_00,(string *)local_c8,(string *)((long)&te_body.field_2 + 8),
                              (string *)((long)&vs_body.field_2 + 8),(string *)local_58,
                              (string *)((long)&gs_body.field_2 + 8),(GLchar **)0x0,&local_cc,
                              &this->m_vs_id,&this->m_tc_id,&this->m_te_id,&this->m_gs_id,
                              &this->m_fs_id,&this->m_po_id);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    (*gl_00->genTextures)(1,&this->m_to_id);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glGenTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x242c);
    (*gl_00->bindTexture)(0xde1,this->m_to_id);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x242f);
    (*gl_00->texStorage2D)(0xde1,1,0x8814,this->m_to_width,this->m_to_height);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2433);
    (*gl_00->genFramebuffers)(1,&this->m_fbo_id);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glGenFramebuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2437);
    (*gl_00->bindFramebuffer)(0x8d40,this->m_fbo_id);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glBindFramebuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x243a);
    (*gl_00->framebufferTexture2D)(0x8ca9,0x8ce0,0xde1,this->m_to_id,0);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glFramebufferTexture2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x243d);
    (*gl_00->pixelStorei)(0xd05,1);
    GVar3 = (*gl_00->getError)();
    glu::checkError(GVar3,"glPixelStorei() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2441);
    pfVar5 = (float *)operator_new__((ulong)(this->m_to_width * this->m_to_height * 4) << 2);
    this->m_to_data = pfVar5;
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)(vs_body.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(te_body.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(gs_body.field_2._M_local_buf + 8));
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to link test program object",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x2427);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FunctionalTest17::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Configure GL_PATCH_VERTICES so that TC only takes a single patch vertex */
	gl.patchParameteri(GL_PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteri() call failed.");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up test program object */
	std::string fs_body = getFragmentShaderBody();
	std::string gs_body = getGeometryShaderBody();
	std::string tc_body = getTessellationControlShaderBody();
	std::string te_body = getTessellationEvaluationShaderBody();
	std::string vs_body = getVertexShaderBody();

	if (!Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, DE_NULL, /* xfb_varyings */
							 DE_NULL,												   /* n_xfb_varyings */
							 &m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		TCU_FAIL("Failed to link test program object");
	}

	/* Set up a texture object that will be used as a color attachment */
	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
					GL_RGBA32F, m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Set up FBO */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_id, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Make sure glReadPixels() does not return misaligned data */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");

	/* Initialize a buffer that will be used to store rendered data */
	m_to_data = new float[m_to_width * m_to_height * 4 /* rgba */];
}